

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyDropSections(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  int iVar2;
  
  pLVar1 = doc->lexer;
  do {
    while( true ) {
      while( true ) {
        if (node == (Node *)0x0) {
          return;
        }
        if (node->type == SectionTag) break;
        if (node->content != (Node *)0x0) {
          prvTidyDropSections(doc,node->content);
        }
        node = node->next;
      }
      iVar2 = prvTidytmbstrncmp(pLVar1->lexbuf + node->start,"if",2);
      if (iVar2 == 0) break;
LAB_00147263:
      node = prvTidyDiscardElement(doc,node);
    }
    iVar2 = prvTidytmbstrncmp(pLVar1->lexbuf + node->start,"if !vml",7);
    if (iVar2 == 0) goto LAB_00147263;
    node = PruneSection(doc,node);
  } while( true );
}

Assistant:

void TY_(DropSections)( TidyDocImpl* doc, Node* node )
{
    Lexer* lexer = doc->lexer;
    while (node)
    {
        if (node->type == SectionTag)
        {
            /* prune up to matching endif */
            if ((TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0) &&
                (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if !vml", 7) != 0)) /* #444394 - fix 13 Sep 01 */
            {
                node = PruneSection( doc, node );
                continue;
            }

            /* discard others as well */
            node = TY_(DiscardElement)( doc, node );
            continue;
        }

        if (node->content)
            TY_(DropSections)( doc, node->content );

        node = node->next;
    }
}